

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

lws_role_ops * lws_role_by_name(char *name)

{
  lws_role_ops *plVar1;
  int iVar2;
  lws_role_ops *ar;
  lws_role_ops **ppxx;
  char *name_local;
  
  ar = (lws_role_ops *)available_roles;
  while (ar->name != (char *)0x0) {
    plVar1 = (lws_role_ops *)ar->name;
    iVar2 = strcmp(plVar1->name,name);
    ar = (lws_role_ops *)&ar->alpn;
    if (iVar2 == 0) {
      return plVar1;
    }
  }
  iVar2 = strcmp(name,"raw-skt");
  if (iVar2 == 0) {
    name_local = (char *)&role_ops_raw_skt;
    return (lws_role_ops *)name_local;
  }
  iVar2 = strcmp(name,"raw-file");
  if (iVar2 == 0) {
    name_local = (char *)&role_ops_raw_file;
    return (lws_role_ops *)name_local;
  }
  return (lws_role_ops *)0x0;
}

Assistant:

const struct lws_role_ops *
lws_role_by_name(const char *name)
{
	LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar)
		if (!strcmp(ar->name, name))
			return ar;
	LWS_FOR_EVERY_AVAILABLE_ROLE_END;

	if (!strcmp(name, role_ops_raw_skt.name))
		return &role_ops_raw_skt;

#if defined(LWS_ROLE_RAW_FILE)
	if (!strcmp(name, role_ops_raw_file.name))
		return &role_ops_raw_file;
#endif

	return NULL;
}